

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

bool __thiscall S2Cell::Subdivide(S2Cell *this,S2Cell *children)

{
  ulong uVar1;
  S2CellId SVar2;
  double *pdVar3;
  byte *pbVar4;
  long lVar5;
  int b;
  undefined1 *puVar6;
  BasicVector<Vector2,_double,_2UL> *pBVar7;
  uint b_00;
  double dVar8;
  R2Point RVar9;
  double local_58;
  double local_50;
  
  uVar1 = (this->id_).id_;
  if ((uVar1 & 1) == 0) {
    RVar9 = S2CellId::GetCenterUV(&this->id_);
    SVar2 = S2CellId::child_begin(&this->id_);
    pbVar4 = (byte *)&S2::internal::kPosToOrientation;
    puVar6 = S2::internal::kPosToIJ;
    for (lVar5 = 0; local_58 = RVar9.c_[1], local_50 = RVar9.c_[0], lVar5 != 0xe0;
        lVar5 = lVar5 + 0x38) {
      pBVar7 = (BasicVector<Vector2,_double,_2UL> *)
               ((long)(children->uv_).bounds_[0].bounds_.c_ + lVar5);
      *(int8 *)((long)((children->uv_).bounds_ + -1) + lVar5) = this->face_;
      *(int8 *)((long)(children->uv_).bounds_[0].bounds_.c_ + lVar5 + -0xf) = this->level_ + '\x01';
      *(byte *)((long)(children->uv_).bounds_[0].bounds_.c_ + lVar5 + -0xe) =
           this->orientation_ ^ *pbVar4;
      *(uint64 *)((long)(children->uv_).bounds_[0].bounds_.c_ + lVar5 + -0xd) = SVar2.id_;
      b = (int)*(uint *)(puVar6 + (long)this->orientation_ * 0x10) >> 1;
      b_00 = *(uint *)(puVar6 + (long)this->orientation_ * 0x10) & 1;
      dVar8 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                        ((BasicVector<Vector2,_double,_2UL> *)&this->uv_,b);
      pdVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[](pBVar7,b);
      *pdVar3 = dVar8;
      pdVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                         (pBVar7,1 - b);
      *pdVar3 = local_50;
      dVar8 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                        ((BasicVector<Vector2,_double,_2UL> *)((this->uv_).bounds_ + 1),b_00);
      pBVar7 = (BasicVector<Vector2,_double,_2UL> *)
               ((long)(children->uv_).bounds_[1].bounds_.c_ + lVar5);
      pdVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                         (pBVar7,b_00);
      *pdVar3 = dVar8;
      pdVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                         (pBVar7,b_00 ^ 1);
      *pdVar3 = local_58;
      SVar2.id_ = SVar2.id_ + (-SVar2.id_ & SVar2.id_) * 2;
      pbVar4 = pbVar4 + 4;
      puVar6 = puVar6 + 4;
    }
  }
  return (uVar1 & 1) == 0;
}

Assistant:

bool S2Cell::Subdivide(S2Cell children[4]) const {
  // This function is equivalent to just iterating over the child cell ids
  // and calling the S2Cell constructor, but it is about 2.5 times faster.

  if (id_.is_leaf()) return false;

  // Compute the cell midpoint in uv-space.
  R2Point uv_mid = id_.GetCenterUV();

  // Create four children with the appropriate bounds.
  S2CellId id = id_.child_begin();
  for (int pos = 0; pos < 4; ++pos, id = id.next()) {
    S2Cell *child = &children[pos];
    child->face_ = face_;
    child->level_ = level_ + 1;
    child->orientation_ = orientation_ ^ kPosToOrientation[pos];
    child->id_ = id;
    // We want to split the cell in half in "u" and "v".  To decide which
    // side to set equal to the midpoint value, we look at cell's (i,j)
    // position within its parent.  The index for "i" is in bit 1 of ij.
    int ij = kPosToIJ[orientation_][pos];
    int i = ij >> 1;
    int j = ij & 1;
    child->uv_[0][i] = uv_[0][i];
    child->uv_[0][1-i] = uv_mid[0];
    child->uv_[1][j] = uv_[1][j];
    child->uv_[1][1-j] = uv_mid[1];
  }
  return true;
}